

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O3

void __thiscall
chrono::ChLoaderUVWdistributed::ComputeQ
          (ChLoaderUVWdistributed *this,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  ChVectorDynamic<> *pCVar1;
  element_type *peVar2;
  double *pdVar3;
  _func_int *p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  ChVectorDynamic<> *pCVar12;
  char cVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  SrcEvaluatorType srcEvaluator;
  long *plVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  Index size;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ChVectorDynamic<> mNF;
  double detJ;
  ActualDstType actualDst;
  ChVectorDynamic<> mF;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  ulong local_98;
  long local_90;
  ulong local_88;
  long local_80;
  double local_78;
  ChVectorDynamic<> *local_70;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  long local_58;
  long local_50;
  ChVectorDynamic<> *local_48;
  ChVectorDynamic<> *local_40;
  long local_38;
  
  peVar2 = (this->super_ChLoaderUVW).loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar1 = &(this->super_ChLoaderUVW).super_ChLoader.Q;
  iVar14 = (**(code **)(*(long *)(peVar2 + *(long *)(*(long *)peVar2 + -0x78)) + 0x18))
                     (peVar2 + *(long *)(*(long *)peVar2 + -0x78));
  local_70 = pCVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar14);
  lVar18 = (this->super_ChLoaderUVW).super_ChLoader.Q.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (-1 < lVar18) {
    if (lVar18 != 0) {
      memset((local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar18 << 3);
    }
    peVar2 = (this->super_ChLoaderUVW).loadable.
             super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar14 = (**(code **)(*(long *)(peVar2 + *(long *)(*(long *)peVar2 + -0x78)) + 0x38))
                       (peVar2 + *(long *)(*(long *)peVar2 + -0x78));
    local_68.m_storage.m_data = (double *)0x0;
    local_68.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_68,(long)iVar14);
    if (-1 < local_68.m_storage.m_rows) {
      if (local_68.m_storage.m_rows != 0) {
        memset(local_68.m_storage.m_data,0,local_68.m_storage.m_rows << 3);
      }
      cVar13 = (**(code **)(*(long *)(this->super_ChLoaderUVW).loadable.
                                     super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr + 0x78))();
      local_48 = state_x;
      local_40 = state_w;
      if (cVar13 == '\0') {
        cVar13 = (**(code **)(*(long *)(this->super_ChLoaderUVW).loadable.
                                       super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + 0x80))();
        p_Var4 = (this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6];
        if (cVar13 == '\0') {
          iVar14 = (*p_Var4)();
          lVar18 = chrono::ChQuadrature::GetStaticTables();
          if ((ulong)((*(long *)(lVar18 + 0x20) - *(long *)(lVar18 + 0x18) >> 3) *
                     -0x5555555555555555) < (ulong)(long)iVar14) {
            __assert_fail("GetIntegrationPointsU() <= ChQuadrature::GetStaticTables()->Lroots.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x76,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[7])();
          lVar18 = chrono::ChQuadrature::GetStaticTables();
          if ((ulong)((*(long *)(lVar18 + 0x20) - *(long *)(lVar18 + 0x18) >> 3) *
                     -0x5555555555555555) < (ulong)(long)iVar14) {
            __assert_fail("GetIntegrationPointsV() <= ChQuadrature::GetStaticTables()->Lroots.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x77,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])();
          lVar18 = chrono::ChQuadrature::GetStaticTables();
          if ((ulong)((*(long *)(lVar18 + 0x20) - *(long *)(lVar18 + 0x18) >> 3) *
                     -0x5555555555555555) < (ulong)(long)iVar14) {
            __assert_fail("GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x78,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          lVar18 = chrono::ChQuadrature::GetStaticTables();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          lVar27 = (long)iVar14 * 0x18 + *(long *)(lVar18 + 0x18);
          plVar17 = (long *)chrono::ChQuadrature::GetStaticTables();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          local_50 = (long)iVar14 * 0x18 + *plVar17;
          lVar18 = chrono::ChQuadrature::GetStaticTables();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[7])();
          lVar23 = (long)iVar14 * 0x18 + *(long *)(lVar18 + 0x18);
          plVar17 = (long *)chrono::ChQuadrature::GetStaticTables();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[7])();
          local_58 = (long)iVar14 * 0x18 + *plVar17;
          lVar18 = chrono::ChQuadrature::GetStaticTables();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])();
          local_90 = (long)iVar14 * 0x18 + *(long *)(lVar18 + 0x18);
          plVar17 = (long *)chrono::ChQuadrature::GetStaticTables();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])(this);
          local_38 = (long)iVar14 * 0x18 + *plVar17;
          local_a8.m_storage.m_data = (double *)0x0;
          local_a8.m_storage.m_rows = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_a8,
                     (this->super_ChLoaderUVW).super_ChLoader.Q.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                    );
          lVar18 = *(long *)(lVar27 + -0x18);
          lVar19 = *(long *)(lVar27 + -0x10);
          if (lVar19 != lVar18) {
            lVar21 = *(long *)(lVar23 + -0x10);
            lVar20 = *(long *)(lVar23 + -0x18);
            uVar26 = 0;
            lVar25 = lVar21;
            local_80 = lVar23;
            do {
              bVar28 = lVar25 != lVar20;
              lVar25 = lVar20;
              if (bVar28) {
                uVar22 = 0;
                lVar19 = *(long *)(local_90 + -0x18);
                lVar18 = *(long *)(local_90 + -0x10);
                do {
                  bVar28 = lVar18 != lVar19;
                  lVar18 = lVar19;
                  if (bVar28) {
                    uVar24 = 0;
                    local_88 = uVar22;
                    do {
                      pCVar12 = local_40;
                      pCVar1 = local_48;
                      local_98 = uVar24;
                      (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
                                (this,&local_68,local_48,local_40);
                      peVar2 = (this->super_ChLoaderUVW).loadable.
                               super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr;
                      (**(code **)(*(long *)peVar2 + 0x68))
                                (*(undefined8 *)(*(long *)(lVar27 + -0x18) + uVar26 * 8),
                                 *(undefined8 *)(*(long *)(local_80 + -0x18) + local_88 * 8),
                                 *(undefined8 *)(*(long *)(local_90 + -0x18) + local_98 * 8),peVar2,
                                 &local_a8,&local_78,&local_68,pCVar1,pCVar12);
                      if (local_a8.m_storage.m_rows < 0) goto LAB_00128561;
                      uVar22 = local_a8.m_storage.m_rows & 0x7ffffffffffffff8;
                      auVar37._8_8_ = 0;
                      auVar37._0_8_ =
                           local_78 * *(double *)(*(long *)(local_50 + -0x18) + uVar26 * 8) *
                           *(double *)(*(long *)(local_58 + -0x18) + local_88 * 8) *
                           *(double *)(*(long *)(local_38 + -0x18) + local_98 * 8);
                      if (7 < (ulong)local_a8.m_storage.m_rows) {
                        auVar29 = vbroadcastsd_avx512f(auVar37);
                        uVar24 = 0;
                        do {
                          auVar30 = vmulpd_avx512f(auVar29,*(undefined1 (*) [64])
                                                            (local_a8.m_storage.m_data + uVar24));
                          *(undefined1 (*) [64])(local_a8.m_storage.m_data + uVar24) = auVar30;
                          uVar24 = uVar24 + 8;
                        } while (uVar24 < uVar22);
                      }
                      auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      if ((long)uVar22 < local_a8.m_storage.m_rows) {
                        auVar30 = vbroadcastsd_avx512f(auVar37);
                        auVar31 = vpbroadcastq_avx512f();
                        uVar24 = 0;
                        do {
                          auVar32 = vpbroadcastq_avx512f();
                          auVar32 = vporq_avx512f(auVar32,auVar29);
                          uVar11 = vpcmpuq_avx512f(auVar32,auVar31,2);
                          pdVar3 = local_a8.m_storage.m_data + uVar22 + uVar24;
                          auVar32._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * (long)pdVar3[1];
                          auVar32._0_8_ = (ulong)((byte)uVar11 & 1) * (long)*pdVar3;
                          auVar32._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * (long)pdVar3[2];
                          auVar32._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * (long)pdVar3[3];
                          auVar32._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * (long)pdVar3[4];
                          auVar32._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * (long)pdVar3[5];
                          auVar32._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * (long)pdVar3[6];
                          auVar32._56_8_ = (uVar11 >> 7) * (long)pdVar3[7];
                          auVar32 = vmulpd_avx512f(auVar30,auVar32);
                          pdVar3 = local_a8.m_storage.m_data + uVar22 + uVar24;
                          bVar28 = (bool)((byte)uVar11 & 1);
                          bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
                          bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
                          bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
                          bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
                          bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
                          bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
                          *pdVar3 = (double)((ulong)bVar28 * auVar32._0_8_ |
                                            (ulong)!bVar28 * (long)*pdVar3);
                          pdVar3[1] = (double)((ulong)bVar5 * auVar32._8_8_ |
                                              (ulong)!bVar5 * (long)pdVar3[1]);
                          pdVar3[2] = (double)((ulong)bVar6 * auVar32._16_8_ |
                                              (ulong)!bVar6 * (long)pdVar3[2]);
                          pdVar3[3] = (double)((ulong)bVar7 * auVar32._24_8_ |
                                              (ulong)!bVar7 * (long)pdVar3[3]);
                          pdVar3[4] = (double)((ulong)bVar8 * auVar32._32_8_ |
                                              (ulong)!bVar8 * (long)pdVar3[4]);
                          pdVar3[5] = (double)((ulong)bVar9 * auVar32._40_8_ |
                                              (ulong)!bVar9 * (long)pdVar3[5]);
                          pdVar3[6] = (double)((ulong)bVar10 * auVar32._48_8_ |
                                              (ulong)!bVar10 * (long)pdVar3[6]);
                          pdVar3[7] = (double)((uVar11 >> 7) * auVar32._56_8_ |
                                              (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar3[7]);
                          uVar24 = uVar24 + 8;
                        } while ((((uint)local_a8.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar24)
                        ;
                      }
                      if ((this->super_ChLoaderUVW).super_ChLoader.Q.
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_rows != local_a8.m_storage.m_rows) goto LAB_00128583;
                      pdVar3 = (local_70->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data;
                      if (7 < local_a8.m_storage.m_rows) {
                        uVar24 = 0;
                        do {
                          auVar29 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                    (local_a8.m_storage.m_data + uVar24),
                                                   *(undefined1 (*) [64])(pdVar3 + uVar24));
                          *(undefined1 (*) [64])(pdVar3 + uVar24) = auVar29;
                          uVar24 = uVar24 + 8;
                        } while (uVar24 < uVar22);
                      }
                      if ((long)uVar22 < local_a8.m_storage.m_rows) {
                        do {
                          pdVar3[uVar22] = local_a8.m_storage.m_data[uVar22] + pdVar3[uVar22];
                          uVar22 = uVar22 + 1;
                        } while (local_a8.m_storage.m_rows != uVar22);
                      }
                      uVar24 = (ulong)((int)local_98 + 1);
                      lVar19 = *(long *)(local_90 + -0x18);
                    } while (uVar24 < (ulong)(*(long *)(local_90 + -0x10) - lVar19 >> 3));
                    lVar20 = *(long *)(local_80 + -0x18);
                    lVar21 = *(long *)(local_80 + -0x10);
                    uVar22 = local_88;
                    lVar18 = *(long *)(local_90 + -0x10);
                  }
                  uVar22 = (ulong)((int)uVar22 + 1);
                } while (uVar22 < (ulong)(lVar21 - lVar20 >> 3));
                lVar18 = *(long *)(lVar27 + -0x18);
                lVar19 = *(long *)(lVar27 + -0x10);
                lVar25 = lVar21;
              }
              uVar26 = (ulong)((int)uVar26 + 1);
            } while (uVar26 < (ulong)(lVar19 - lVar18 >> 3));
          }
        }
        else {
          iVar14 = (*p_Var4)();
          plVar17 = (long *)chrono::ChQuadrature::GetStaticTablesTriangle();
          if ((ulong)((plVar17[1] - *plVar17 >> 3) * -0x5555555555555555) < (ulong)(long)iVar14) {
            __assert_fail("GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTriangle()->Weight.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x5a,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          lVar18 = chrono::ChQuadrature::GetStaticTablesTriangle();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          uVar26 = (long)iVar14 * 0x18 + *(long *)(lVar18 + 0x18);
          lVar18 = chrono::ChQuadrature::GetStaticTablesTriangle();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          local_90 = (long)iVar14 * 0x18 + *(long *)(lVar18 + 0x30);
          plVar17 = (long *)chrono::ChQuadrature::GetStaticTablesTriangle();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
          local_50 = (long)iVar14 * 0x18 + *plVar17;
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])();
          lVar18 = chrono::ChQuadrature::GetStaticTables();
          if ((ulong)((*(long *)(lVar18 + 0x20) - *(long *)(lVar18 + 0x18) >> 3) *
                     -0x5555555555555555) < (ulong)(long)iVar14) {
            __assert_fail("GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size()"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                          ,0x5e,
                          "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                         );
          }
          lVar18 = chrono::ChQuadrature::GetStaticTables();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])();
          local_80 = (long)iVar14 * 0x18 + *(long *)(lVar18 + 0x18);
          plVar17 = (long *)chrono::ChQuadrature::GetStaticTables();
          iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[8])(this);
          local_58 = (long)iVar14 * 0x18 + *plVar17;
          local_a8.m_storage.m_data = (double *)0x0;
          local_a8.m_storage.m_rows = 0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    (&local_a8,
                     (this->super_ChLoaderUVW).super_ChLoader.Q.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                    );
          pCVar1 = local_40;
          lVar18 = *(long *)(uVar26 - 0x18);
          lVar19 = *(long *)(uVar26 - 0x10);
          if (lVar19 != lVar18) {
            uVar22 = 0;
            lVar27 = *(long *)(local_80 + -0x18);
            lVar23 = *(long *)(local_80 + -0x10);
            lVar20 = local_90;
            local_88 = uVar26;
            do {
              bVar28 = lVar23 != lVar27;
              lVar23 = lVar27;
              if (bVar28) {
                uVar26 = 0;
                do {
                  pCVar12 = local_48;
                  local_98 = uVar26;
                  (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
                            (this,&local_68,local_48,pCVar1);
                  peVar2 = (this->super_ChLoaderUVW).loadable.
                           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr;
                  (**(code **)(*(long *)peVar2 + 0x68))
                            (*(undefined8 *)(*(long *)(local_88 - 0x18) + uVar22 * 8),
                             *(undefined8 *)(*(long *)(lVar20 + -0x18) + uVar22 * 8),
                             *(undefined8 *)(*(long *)(lVar20 + -0x18) + local_98 * 8),peVar2,
                             &local_a8,&local_78,&local_68,pCVar12,pCVar1);
                  auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                  if (local_a8.m_storage.m_rows < 0) goto LAB_00128561;
                  uVar26 = local_a8.m_storage.m_rows & 0x7ffffffffffffff8;
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ =
                       local_78 * *(double *)(*(long *)(local_50 + -0x18) + uVar22 * 8) *
                       *(double *)(*(long *)(local_58 + -0x18) + local_98 * 8) * 0.5;
                  if (7 < (ulong)local_a8.m_storage.m_rows) {
                    auVar30 = vbroadcastsd_avx512f(auVar36);
                    uVar24 = 0;
                    do {
                      auVar31 = vmulpd_avx512f(auVar30,*(undefined1 (*) [64])
                                                        (local_a8.m_storage.m_data + uVar24));
                      *(undefined1 (*) [64])(local_a8.m_storage.m_data + uVar24) = auVar31;
                      uVar24 = uVar24 + 8;
                    } while (uVar24 < uVar26);
                  }
                  if ((long)uVar26 < local_a8.m_storage.m_rows) {
                    auVar30 = vbroadcastsd_avx512f(auVar36);
                    auVar31 = vpbroadcastq_avx512f();
                    uVar24 = 0;
                    do {
                      auVar32 = vpbroadcastq_avx512f();
                      auVar32 = vporq_avx512f(auVar32,auVar29);
                      uVar11 = vpcmpuq_avx512f(auVar32,auVar31,2);
                      pdVar3 = local_a8.m_storage.m_data + uVar26 + uVar24;
                      auVar34._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * (long)pdVar3[1];
                      auVar34._0_8_ = (ulong)((byte)uVar11 & 1) * (long)*pdVar3;
                      auVar34._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * (long)pdVar3[2];
                      auVar34._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * (long)pdVar3[3];
                      auVar34._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * (long)pdVar3[4];
                      auVar34._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * (long)pdVar3[5];
                      auVar34._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * (long)pdVar3[6];
                      auVar34._56_8_ = (uVar11 >> 7) * (long)pdVar3[7];
                      auVar32 = vmulpd_avx512f(auVar30,auVar34);
                      pdVar3 = local_a8.m_storage.m_data + uVar26 + uVar24;
                      bVar28 = (bool)((byte)uVar11 & 1);
                      bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
                      bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
                      bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
                      bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
                      bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
                      bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
                      *pdVar3 = (double)((ulong)bVar28 * auVar32._0_8_ |
                                        (ulong)!bVar28 * (long)*pdVar3);
                      pdVar3[1] = (double)((ulong)bVar5 * auVar32._8_8_ |
                                          (ulong)!bVar5 * (long)pdVar3[1]);
                      pdVar3[2] = (double)((ulong)bVar6 * auVar32._16_8_ |
                                          (ulong)!bVar6 * (long)pdVar3[2]);
                      pdVar3[3] = (double)((ulong)bVar7 * auVar32._24_8_ |
                                          (ulong)!bVar7 * (long)pdVar3[3]);
                      pdVar3[4] = (double)((ulong)bVar8 * auVar32._32_8_ |
                                          (ulong)!bVar8 * (long)pdVar3[4]);
                      pdVar3[5] = (double)((ulong)bVar9 * auVar32._40_8_ |
                                          (ulong)!bVar9 * (long)pdVar3[5]);
                      pdVar3[6] = (double)((ulong)bVar10 * auVar32._48_8_ |
                                          (ulong)!bVar10 * (long)pdVar3[6]);
                      pdVar3[7] = (double)((uVar11 >> 7) * auVar32._56_8_ |
                                          (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar3[7]);
                      uVar24 = uVar24 + 8;
                    } while ((((uint)local_a8.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar24);
                  }
                  if ((this->super_ChLoaderUVW).super_ChLoader.Q.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_rows != local_a8.m_storage.m_rows) goto LAB_00128583;
                  pdVar3 = (local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                           ).m_storage.m_data;
                  if (7 < local_a8.m_storage.m_rows) {
                    uVar24 = 0;
                    do {
                      auVar29 = vaddpd_avx512f(*(undefined1 (*) [64])
                                                (local_a8.m_storage.m_data + uVar24),
                                               *(undefined1 (*) [64])(pdVar3 + uVar24));
                      *(undefined1 (*) [64])(pdVar3 + uVar24) = auVar29;
                      uVar24 = uVar24 + 8;
                    } while (uVar24 < uVar26);
                  }
                  if ((long)uVar26 < local_a8.m_storage.m_rows) {
                    do {
                      pdVar3[uVar26] = local_a8.m_storage.m_data[uVar26] + pdVar3[uVar26];
                      uVar26 = uVar26 + 1;
                    } while (local_a8.m_storage.m_rows != uVar26);
                  }
                  uVar26 = (ulong)((int)local_98 + 1);
                  lVar27 = *(long *)(local_80 + -0x18);
                  lVar23 = *(long *)(local_80 + -0x10);
                  lVar20 = local_90;
                } while (uVar26 < (ulong)(lVar23 - lVar27 >> 3));
                lVar18 = *(long *)(local_88 - 0x18);
                lVar19 = *(long *)(local_88 - 0x10);
              }
              uVar22 = (ulong)((int)uVar22 + 1);
            } while (uVar22 < (ulong)(lVar19 - lVar18 >> 3));
          }
        }
      }
      else {
        iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
        plVar17 = (long *)chrono::ChQuadrature::GetStaticTablesTetrahedron();
        if ((ulong)((plVar17[1] - *plVar17 >> 3) * -0x5555555555555555) < (ulong)(long)iVar14) {
          __assert_fail("GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTetrahedron()->Weight.size()"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLoaderUVW.h"
                        ,0x44,
                        "virtual void chrono::ChLoaderUVWdistributed::ComputeQ(ChVectorDynamic<> *, ChVectorDynamic<> *)"
                       );
        }
        lVar18 = chrono::ChQuadrature::GetStaticTablesTetrahedron();
        iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
        local_98 = (long)iVar14 * 0x18 + *(long *)(lVar18 + 0x18);
        lVar18 = chrono::ChQuadrature::GetStaticTablesTetrahedron();
        iVar14 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
        lVar18 = *(long *)(lVar18 + 0x30);
        lVar19 = chrono::ChQuadrature::GetStaticTablesTetrahedron();
        iVar15 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])();
        lVar19 = *(long *)(lVar19 + 0x48);
        plVar17 = (long *)chrono::ChQuadrature::GetStaticTablesTetrahedron();
        iVar16 = (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[6])(this);
        local_90 = (long)iVar16 * 0x18 + *plVar17;
        local_a8.m_storage.m_data = (double *)0x0;
        local_a8.m_storage.m_rows = 0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&local_a8,
                   (this->super_ChLoaderUVW).super_ChLoader.Q.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
        pCVar12 = local_40;
        pCVar1 = local_48;
        if (*(long *)(local_98 - 0x10) != *(long *)(local_98 - 0x18)) {
          uVar26 = 0;
          local_88 = (long)iVar15 * 0x18 + lVar19;
          do {
            (*(this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader[5])
                      (this,&local_68,pCVar1,pCVar12);
            peVar2 = (this->super_ChLoaderUVW).loadable.
                     super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            (**(code **)(*(long *)peVar2 + 0x68))
                      (*(undefined8 *)(*(long *)(local_98 - 0x18) + uVar26 * 8),
                       *(undefined8 *)(*(long *)((long)iVar14 * 0x18 + lVar18 + -0x18) + uVar26 * 8)
                       ,*(undefined8 *)(*(long *)(local_88 - 0x18) + uVar26 * 8),peVar2,&local_a8,
                       &local_78,&local_68,pCVar1,pCVar12);
            if (local_a8.m_storage.m_rows < 0) goto LAB_00128561;
            auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            uVar22 = local_a8.m_storage.m_rows & 0x7ffffffffffffff8;
            auVar35._8_8_ = 0;
            auVar35._0_8_ =
                 local_78 * *(double *)(*(long *)(local_90 + -0x18) + uVar26 * 8) *
                 0.16666666666666666;
            if (7 < (ulong)local_a8.m_storage.m_rows) {
              auVar30 = vbroadcastsd_avx512f(auVar35);
              uVar24 = 0;
              do {
                auVar31 = vmulpd_avx512f(auVar30,*(undefined1 (*) [64])
                                                  (local_a8.m_storage.m_data + uVar24));
                *(undefined1 (*) [64])(local_a8.m_storage.m_data + uVar24) = auVar31;
                uVar24 = uVar24 + 8;
              } while (uVar24 < uVar22);
            }
            if ((long)uVar22 < local_a8.m_storage.m_rows) {
              auVar30 = vbroadcastsd_avx512f(auVar35);
              auVar31 = vpbroadcastq_avx512f();
              uVar24 = 0;
              do {
                auVar32 = vpbroadcastq_avx512f();
                auVar32 = vporq_avx512f(auVar32,auVar29);
                uVar11 = vpcmpuq_avx512f(auVar32,auVar31,2);
                pdVar3 = local_a8.m_storage.m_data + uVar22 + uVar24;
                auVar33._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * (long)pdVar3[1];
                auVar33._0_8_ = (ulong)((byte)uVar11 & 1) * (long)*pdVar3;
                auVar33._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * (long)pdVar3[2];
                auVar33._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * (long)pdVar3[3];
                auVar33._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * (long)pdVar3[4];
                auVar33._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * (long)pdVar3[5];
                auVar33._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * (long)pdVar3[6];
                auVar33._56_8_ = (uVar11 >> 7) * (long)pdVar3[7];
                auVar32 = vmulpd_avx512f(auVar30,auVar33);
                pdVar3 = local_a8.m_storage.m_data + uVar22 + uVar24;
                bVar28 = (bool)((byte)uVar11 & 1);
                bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
                bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
                bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
                bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
                bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
                bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
                *pdVar3 = (double)((ulong)bVar28 * auVar32._0_8_ | (ulong)!bVar28 * (long)*pdVar3);
                pdVar3[1] = (double)((ulong)bVar5 * auVar32._8_8_ | (ulong)!bVar5 * (long)pdVar3[1])
                ;
                pdVar3[2] = (double)((ulong)bVar6 * auVar32._16_8_ | (ulong)!bVar6 * (long)pdVar3[2]
                                    );
                pdVar3[3] = (double)((ulong)bVar7 * auVar32._24_8_ | (ulong)!bVar7 * (long)pdVar3[3]
                                    );
                pdVar3[4] = (double)((ulong)bVar8 * auVar32._32_8_ | (ulong)!bVar8 * (long)pdVar3[4]
                                    );
                pdVar3[5] = (double)((ulong)bVar9 * auVar32._40_8_ | (ulong)!bVar9 * (long)pdVar3[5]
                                    );
                pdVar3[6] = (double)((ulong)bVar10 * auVar32._48_8_ |
                                    (ulong)!bVar10 * (long)pdVar3[6]);
                pdVar3[7] = (double)((uVar11 >> 7) * auVar32._56_8_ |
                                    (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar3[7]);
                uVar24 = uVar24 + 8;
              } while ((((uint)local_a8.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar24);
            }
            if ((this->super_ChLoaderUVW).super_ChLoader.Q.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
                local_a8.m_storage.m_rows) {
LAB_00128583:
              __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                            "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                            "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                           );
            }
            pdVar3 = (local_70->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_data;
            if (7 < local_a8.m_storage.m_rows) {
              uVar24 = 0;
              do {
                auVar29 = vaddpd_avx512f(*(undefined1 (*) [64])(local_a8.m_storage.m_data + uVar24),
                                         *(undefined1 (*) [64])(pdVar3 + uVar24));
                *(undefined1 (*) [64])(pdVar3 + uVar24) = auVar29;
                uVar24 = uVar24 + 8;
              } while (uVar24 < uVar22);
            }
            if ((long)uVar22 < local_a8.m_storage.m_rows) {
              do {
                pdVar3[uVar22] = local_a8.m_storage.m_data[uVar22] + pdVar3[uVar22];
                uVar22 = uVar22 + 1;
              } while (local_a8.m_storage.m_rows != uVar22);
            }
            uVar26 = (ulong)((int)uVar26 + 1);
          } while (uVar26 < (ulong)(*(long *)(local_98 - 0x10) - *(long *)(local_98 - 0x18) >> 3));
        }
      }
      if (local_a8.m_storage.m_data != (double *)0x0) {
        free((void *)local_a8.m_storage.m_data[-1]);
      }
      if (local_68.m_storage.m_data != (double *)0x0) {
        free((void *)local_68.m_storage.m_data[-1]);
      }
      return;
    }
  }
LAB_00128561:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

virtual void ComputeQ(ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                          ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                          ) override {
        Q.setZero(loadable->LoadableGet_ndof_w());
        ChVectorDynamic<> mF(loadable->Get_field_ncoords());
        mF.setZero();

        if (loadable->IsTetrahedronIntegrationNeeded()) {
            // case of tetrahedron: use special 3d quadrature tables (given U,V,W orders, use the U only)
            assert(GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTetrahedron()->Weight.size());
            const std::vector<double>& Ulroots = ChQuadrature::GetStaticTablesTetrahedron()->LrootsU[GetIntegrationPointsU() - 1];
            const std::vector<double>& Vlroots = ChQuadrature::GetStaticTablesTetrahedron()->LrootsV[GetIntegrationPointsU() - 1];
            const std::vector<double>& Wlroots = ChQuadrature::GetStaticTablesTetrahedron()->LrootsW[GetIntegrationPointsU() - 1];
            const std::vector<double>& weight =  ChQuadrature::GetStaticTablesTetrahedron()->Weight[GetIntegrationPointsU() - 1];

            ChVectorDynamic<> mNF(Q.size());  // temporary value for loop

            // Gauss quadrature :  Q = sum (N'*F*detJ * wi * 1/6)   often detJ=6*tetrahedron volume
            for (unsigned int i = 0; i < Ulroots.size(); i++) {
                double detJ;
                // Compute F= F(u,v,w)
                this->ComputeF(Ulroots[i], Vlroots[i], Wlroots[i], mF, state_x, state_w);
                // Compute mNF= N(u,v,w)'*F
                loadable->ComputeNF(Ulroots[i], Vlroots[i], Wlroots[i], mNF, detJ, mF, state_x, state_w);
                // Compute Q+= mNF * detJ * wi * 1/6
                mNF *= (detJ * weight[i] * (1. / 6.));  // (the 1/6 coefficient is not in the table);
                Q += mNF;
            }
		}
		else if (loadable->IsTrianglePrismIntegrationNeeded()) {
			// Case of triangle prism: quadrature on u,v in [0..1] for the triangle, on w in [-1...+1] for thickness.
			assert(GetIntegrationPointsU() <= ChQuadrature::GetStaticTablesTriangle()->Weight.size());
            const std::vector<double>& Ulroots = ChQuadrature::GetStaticTablesTriangle()->LrootsU[GetIntegrationPointsU() - 1];
            const std::vector<double>& Vlroots = ChQuadrature::GetStaticTablesTriangle()->LrootsV[GetIntegrationPointsU() - 1];
            const std::vector<double>& weight = ChQuadrature::GetStaticTablesTriangle()->Weight[GetIntegrationPointsU() - 1];
			assert(GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size());
			const std::vector<double>& Wlroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsW() - 1];
            const std::vector<double>& Wweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsW() - 1];

			ChVectorDynamic<> mNF(Q.size());  // temporary value for loop

			// Gauss quadrature :  Q = sum (N'*F*detJ * wi * wj *1/2)   often detJ= 2 * triangle area
			// This requires a single outer for loop over all triangle points, already queued in arrays Ulroots Vlroots, 
			// and an inner loop over thickness points Wlroots.
            for (unsigned int i = 0; i < Ulroots.size(); i++) {
				for (unsigned int iw = 0; iw < Wlroots.size(); iw++) {
					double detJ;
					// Compute F= F(u,v)
					this->ComputeF(Ulroots[i], Vlroots[i], Vlroots[iw], mF, state_x, state_w);
					// Compute mNF= N(u,v)'*F
					loadable->ComputeNF(Ulroots[i], Vlroots[i], Vlroots[iw], mNF, detJ, mF, state_x, state_w);
					// Compute Q+= mNF * detJ * wi *1/2
					mNF *= (detJ * weight[i] * Wweight[iw] * (1. / 2.));  // (the 1/2 coefficient is not in the triangle table);
					Q += mNF;
				}
            }
		}
		else {
            // Case of normal box isoparametric coords (default)
            assert(GetIntegrationPointsU() <= ChQuadrature::GetStaticTables()->Lroots.size());
            assert(GetIntegrationPointsV() <= ChQuadrature::GetStaticTables()->Lroots.size());
            assert(GetIntegrationPointsW() <= ChQuadrature::GetStaticTables()->Lroots.size());
            const std::vector<double>& Ulroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsU() - 1];
            const std::vector<double>& Uweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsU() - 1];
            const std::vector<double>& Vlroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsV() - 1];
            const std::vector<double>& Vweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsV() - 1];
            const std::vector<double>& Wlroots = ChQuadrature::GetStaticTables()->Lroots[GetIntegrationPointsW() - 1];
            const std::vector<double>& Wweight = ChQuadrature::GetStaticTables()->Weight[GetIntegrationPointsW() - 1];

            ChVectorDynamic<> mNF(Q.size());  // temporary value for loop

            // Gauss quadrature :  Q = sum (N'*F*detJ * wi*wj*wk)
            for (unsigned int iu = 0; iu < Ulroots.size(); iu++) {
                for (unsigned int iv = 0; iv < Vlroots.size(); iv++) {
                    for (unsigned int iw = 0; iw < Wlroots.size(); iw++) {
                        double detJ;
                        // Compute F= F(u,v,w)
                        this->ComputeF(Ulroots[iu], Vlroots[iv], Wlroots[iw], mF, state_x, state_w);
                        // Compute mNF= N(u,v,w)'*F
                        loadable->ComputeNF(Ulroots[iu], Vlroots[iv], Wlroots[iw], mNF, detJ, mF, state_x,
                                            state_w);
                        // Compute Q+= mNF * detJ * wi*wj*wk
                        mNF *= (detJ * Uweight[iu] * Vweight[iv] * Wweight[iw]);
                        Q += mNF;
                    }
                }
            }
        }  
    }